

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lc.cpp
# Opt level: O2

bool __thiscall libDAI::LC::initProps(LC *this)

{
  Properties *this_00;
  bool bVar1;
  UpdateType UVar2;
  CavityType CVar3;
  unsigned_long uVar4;
  double dVar5;
  allocator<char> local_71;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  local_70;
  PropertyKey local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"updates",(allocator<char> *)&local_40);
  this_00 = &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"cavity",(allocator<char> *)&local_40);
    bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"tol",(allocator<char> *)&local_40);
      bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"maxiter",(allocator<char> *)&local_40);
        bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"verbose",(allocator<char> *)&local_40);
          bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"updates",(allocator<char> *)&local_40);
            UVar2 = Properties::FromStringTo<libDAI::LC::UpdateType>
                              (this_00,(PropertyKey *)&local_70);
            (this->Props).updates.v = UVar2.v;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"cavity",(allocator<char> *)&local_40);
            CVar3 = Properties::FromStringTo<libDAI::LC::CavityType>
                              (this_00,(PropertyKey *)&local_70);
            (this->Props).cavity.v = CVar3.v;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"reinit",(allocator<char> *)&local_40);
            bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"reinit",(allocator<char> *)&local_40);
              bVar1 = Properties::FromStringTo<bool>(this_00,(PropertyKey *)&local_70);
              (this->Props).reinit = bVar1;
              std::__cxx11::string::~string((string *)&local_70);
            }
            else {
              (this->Props).reinit = true;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"tol",(allocator<char> *)&local_40);
            dVar5 = Properties::FromStringTo<double>(this_00,(PropertyKey *)&local_70);
            (this->Props).tol = dVar5;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"maxiter",(allocator<char> *)&local_40);
            uVar4 = Properties::FromStringTo<unsigned_long>(this_00,(PropertyKey *)&local_70);
            (this->Props).maxiter = uVar4;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"verbose",(allocator<char> *)&local_40);
            uVar4 = Properties::FromStringTo<unsigned_long>(this_00,(PropertyKey *)&local_70);
            (this->Props).verbose = uVar4;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"damping",(allocator<char> *)&local_40);
            bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"damping",(allocator<char> *)&local_40);
              dVar5 = Properties::FromStringTo<double>(this_00,(PropertyKey *)&local_70);
              (this->Props).damping = dVar5;
              std::__cxx11::string::~string((string *)&local_70);
            }
            else {
              (this->Props).damping = 0.0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"cavainame",(allocator<char> *)&local_40);
            bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40,"cavainame",&local_71);
              Properties::GetAs<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_70,this_00,&local_40);
              std::__cxx11::string::operator=
                        ((string *)&(this->Props).cavainame,(string *)&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_40);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"cavaiopts",(allocator<char> *)&local_40);
            bVar1 = Properties::hasKey(this_00,(PropertyKey *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (!bVar1) {
              return true;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"cavaiopts",&local_71);
            Properties::FromStringTo<libDAI::Properties>((Properties *)&local_70,this_00,&local_40);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                         *)&(this->Props).cavaiopts,&local_70);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::~_Rb_tree(&local_70);
            std::__cxx11::string::~string((string *)&local_40);
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool LC::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("cavity") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.cavity  = FromStringTo<CavityType>("cavity");
        if( HasProperty("reinit") )
            Props.reinit = FromStringTo<bool>("reinit");
        else
            Props.reinit = true;
        Props.tol     = FromStringTo<double>("tol");
        Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;
        if (HasProperty("cavainame") )
            Props.cavainame = GetPropertyAs<string>("cavainame");
        if (HasProperty("cavaiopts") )
            Props.cavaiopts = FromStringTo<Properties>("cavaiopts");

        return true;
    }